

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatDotsTexture *
pbrt::FloatDotsTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_72;
  allocator<char> local_71;
  undefined1 local_70 [16];
  TextureMapping2DHandle map;
  string local_58 [32];
  string local_38 [32];
  FloatDotsTexture *pFVar2;
  
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  std::__cxx11::string::string<std::allocator<char>>(local_38,"inside",&local_71);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)(local_70 + 8),(string *)parameters,1.0,
             (memory_resource *)local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"outside",&local_72);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_70,(string *)parameters,0.0,
             (memory_resource *)local_58);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar2 = (FloatDotsTexture *)CONCAT44(extraout_var,iVar1);
  (pFVar2->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (uintptr_t)
          map.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  (pFVar2->outsideDot).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_70._8_8_;
  (pFVar2->insideDot).
  super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  .bits = local_70._0_8_;
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return pFVar2;
}

Assistant:

FloatDotsTexture *FloatDotsTexture::Create(const Transform &renderFromTexture,
                                           const TextureParameterDictionary &parameters,
                                           const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatDotsTexture>(
        map, parameters.GetFloatTexture("inside", 1.f, alloc),
        parameters.GetFloatTexture("outside", 0.f, alloc));
}